

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * make_import(char *prefix,char *mod,char *suffix)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *__s;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t impmodsize;
  char *p;
  char *impmod;
  char *local_28;
  char *local_10;
  
  local_10 = in_RSI;
  if (*in_RSI == '(') {
    local_10 = in_RSI + 1;
  }
  sVar1 = strlen(in_RDI);
  sVar2 = strlen(local_10);
  sVar3 = strlen(in_RDX);
  sVar1 = sVar1 + sVar2 + sVar3 + 1;
  __s = (char *)malloc(sVar1);
  snprintf(__s,sVar1,"%s%s%s",in_RDI,local_10,in_RDX);
  for (local_28 = __s; *local_28 != '\0'; local_28 = local_28 + 1) {
    if (*local_28 == '.') {
      *local_28 = ' ';
    }
  }
  return __s;
}

Assistant:

static char* make_import(const char* prefix, const char* mod, const char* suffix) {
  char *impmod, *p;
  size_t impmodsize;
  if (mod[0] == '(') mod++;
  impmodsize = strlen(prefix) + strlen(mod) + strlen(suffix) + 1;
  impmod = (char*) malloc(impmodsize);
  snprintf(impmod, impmodsize, "%s%s%s", prefix, mod, suffix);
  for (p=impmod; *p; p++)
    if (*p == '.') *p=' ';
  return impmod;
}